

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleReadSymlinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  string result;
  ostringstream e;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [376];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    local_1d8._M_string_length = 0;
    local_1d8.field_2._M_local_buf[0] = '\0';
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    bVar2 = cmsys::SystemTools::ReadSymlink(pbVar1 + 1,&local_1d8);
    if (bVar2) {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,pbVar1 + 2,local_1d8._M_dataplus._M_p);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"READ_SYMLINK requested of path that is not a symlink:\n  ",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,pbVar1[1]._M_dataplus._M_p,pbVar1[1]._M_string_length);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,
                      CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                               local_1d8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," requires a file name and output variable",0x29);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,
                      CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                               local_1d8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleReadSymlinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    std::ostringstream e;
    e << args[0] << " requires a file name and output variable";
    this->SetError(e.str());
    return false;
  }

  const std::string& filename = args[1];
  const std::string& outputVariable = args[2];

  std::string result;
  if (!cmSystemTools::ReadSymlink(filename, result)) {
    std::ostringstream e;
    e << "READ_SYMLINK requested of path that is not a symlink:\n  "
      << filename;
    this->SetError(e.str());
    return false;
  }

  this->Makefile->AddDefinition(outputVariable, result.c_str());

  return true;
}